

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

double * SoapySDRDevice_listSampleRates
                   (SoapySDRDevice *device,int direction,size_t channel,size_t *length)

{
  undefined1 *puVar1;
  double *pdVar2;
  _Vector_base<double,_std::allocator<double>_> _Stack_38;
  
  *length = 0;
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  (**(code **)(*(long *)device + 0x208))(&_Stack_38,device,direction,channel);
  pdVar2 = toNumericList((vector<double,_std::allocator<double>_> *)&_Stack_38,length);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_38);
  return pdVar2;
}

Assistant:

double *SoapySDRDevice_listSampleRates(const SoapySDRDevice *device, const int direction, const size_t channel, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toNumericList(device->listSampleRates(direction, channel), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}